

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

Ptr __thiscall hwnet::ThreadPool::TaskQueue::Get(TaskQueue *this)

{
  pthread_mutex_t *__mutex;
  __shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  Ptr *task;
  Ptr PVar2;
  
  __mutex = (pthread_mutex_t *)(in_RSI + 8);
  std::mutex::lock((mutex *)&__mutex->__data);
  do {
    p_Var1 = *(__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x80);
    if (*in_RSI == '\x01') {
      if (*(__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0xa0) == p_Var1) {
        this->closed = false;
        *(undefined3 *)&this->field_0x1 = 0;
        this->watting = 0;
        (this->mtx).super___mutex_base._M_mutex.__align = 0;
      }
      else {
        std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
        pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                   *)(in_RSI + 0x70));
        std::__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var1);
      }
LAB_0011e8bd:
      pthread_mutex_unlock(__mutex);
      PVar2.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      PVar2.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar2.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (*(__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0xa0) != p_Var1) {
      std::__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var1);
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                 *)(in_RSI + 0x70));
      goto LAB_0011e8bd;
    }
    *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + 1;
    std::_V2::condition_variable_any::wait<std::mutex>
              ((condition_variable_any *)(in_RSI + 0x30),(mutex *)&__mutex->__data);
    *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + -1;
  } while( true );
}

Assistant:

Task::Ptr ThreadPool::TaskQueue::Get() {
	std::lock_guard<std::mutex> guard(this->mtx);
	for( ; ;) {
		if(this->closed) {
			if(this->tasks.empty()) {
				return nullptr;
			} else {
				Task::Ptr &task = this->tasks.front();
				this->tasks.pop_front();
				return task;
			}
		} else {

			if(this->tasks.empty()) {
				++this->watting;//增加等待数量
				this->cv.wait(this->mtx);
				--this->watting;//减少正在等待的线程数量	
			} else {
				Task::Ptr task = this->tasks.front();
				this->tasks.pop_front();
				return task;
			}	
		}
	}
}